

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UChar * __thiscall icu_63::ZNStringPool::get(ZNStringPool *this,UChar *s,UErrorCode *status)

{
  ZNStringPoolChunk *pZVar1;
  int32_t iVar2;
  UChar *pUVar3;
  ZNStringPoolChunk *pZVar4;
  int iVar5;
  UChar *pUVar6;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar6 = s;
    pUVar3 = (UChar *)uhash_get_63(this->fHash,s);
    if (pUVar3 != (UChar *)0x0) {
      return pUVar3;
    }
    iVar2 = u_strlen_63(s);
    pZVar1 = this->fChunks;
    iVar5 = pZVar1->fLimit;
    pZVar4 = pZVar1;
    if (iVar2 < 2000 - iVar5) {
LAB_00216bfc:
      pUVar6 = pZVar4->fStrings + iVar5;
      u_strcpy_63(pUVar6,s);
      this->fChunks->fLimit = this->fChunks->fLimit + iVar2 + 1;
      uhash_put_63(this->fHash,pUVar6,pUVar6,status);
      return pUVar6;
    }
    if (iVar2 < 2000) {
      pZVar4 = (ZNStringPoolChunk *)UMemory::operator_new((UMemory *)0xfb0,(size_t)pUVar6);
      if (pZVar4 != (ZNStringPoolChunk *)0x0) {
        pZVar4->fLimit = 0;
        this->fChunks = pZVar4;
        pZVar4->fNext = pZVar1;
        iVar5 = 0;
        goto LAB_00216bfc;
      }
      this->fChunks = (ZNStringPoolChunk *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
  }
  return L"";
}

Assistant:

const UChar *ZNStringPool::get(const UChar *s, UErrorCode &status) {
    const UChar *pooledString;
    if (U_FAILURE(status)) {
        return &EmptyString;
    }

    pooledString = static_cast<UChar *>(uhash_get(fHash, s));
    if (pooledString != NULL) {
        return pooledString;
    }

    int32_t length = u_strlen(s);
    int32_t remainingLength = POOL_CHUNK_SIZE - fChunks->fLimit;
    if (remainingLength <= length) {
        U_ASSERT(length < POOL_CHUNK_SIZE);
        if (length >= POOL_CHUNK_SIZE) {
            status = U_INTERNAL_PROGRAM_ERROR;
            return &EmptyString;
        }
        ZNStringPoolChunk *oldChunk = fChunks;
        fChunks = new ZNStringPoolChunk;
        if (fChunks == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return &EmptyString;
        }
        fChunks->fNext = oldChunk;
    }
    
    UChar *destString = &fChunks->fStrings[fChunks->fLimit];
    u_strcpy(destString, s);
    fChunks->fLimit += (length + 1);
    uhash_put(fHash, destString, destString, &status);
    return destString;
}